

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcPrint.c
# Opt level: O1

Vec_Int_t * Abc_NtkCollectCiSupps(Abc_Ntk_t *pNtk,int fVerbose)

{
  uint uVar1;
  Vec_Ptr_t *__ptr;
  int iVar2;
  Vec_Ptr_t *pVVar3;
  Vec_Int_t *pVVar4;
  int *piVar5;
  uint *__ptr_00;
  void *pvVar6;
  int iVar7;
  uint uVar8;
  long lVar9;
  long lVar10;
  Vec_Int_t *pVVar11;
  long lVar12;
  timespec ts;
  timespec local_88;
  ulong local_70;
  Vec_Int_t *local_68;
  int local_5c;
  long local_58;
  Vec_Ptr_t *local_50;
  Vec_Int_t *local_48;
  long local_40;
  long local_38;
  
  iVar2 = clock_gettime(3,&local_88);
  if (iVar2 < 0) {
    local_58 = 1;
  }
  else {
    lVar9 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_88.tv_nsec),8);
    local_58 = ((lVar9 >> 7) - (lVar9 >> 0x3f)) + local_88.tv_sec * -1000000;
  }
  piVar5 = (int *)0x0;
  local_5c = fVerbose;
  pVVar3 = Abc_NtkDfs(pNtk,0);
  local_68 = (Vec_Int_t *)malloc(0x10);
  local_68->nCap = 0;
  local_68->nSize = 0;
  local_68->pArray = (int *)0x0;
  iVar2 = pNtk->vCis->nSize;
  pVVar4 = (Vec_Int_t *)malloc(0x10);
  iVar7 = 0x10;
  if (0xe < iVar2 - 1U) {
    iVar7 = iVar2;
  }
  pVVar4->nSize = 0;
  pVVar4->nCap = iVar7;
  if (iVar7 != 0) {
    piVar5 = (int *)malloc((long)iVar7 << 2);
  }
  pVVar4->pArray = piVar5;
  uVar1 = pNtk->vObjs->nSize;
  __ptr_00 = (uint *)malloc(0x10);
  uVar8 = 8;
  if (6 < uVar1 - 1) {
    uVar8 = uVar1;
  }
  __ptr_00[1] = 0;
  *__ptr_00 = uVar8;
  local_70 = (ulong)uVar1;
  local_50 = pVVar3;
  local_48 = pVVar4;
  if (uVar8 == 0) {
    pvVar6 = (void *)0x0;
  }
  else {
    pvVar6 = calloc((long)(int)uVar8,0x10);
  }
  *(void **)(__ptr_00 + 2) = pvVar6;
  __ptr_00[1] = (uint)local_70;
  pVVar3 = pNtk->vCos;
  if (0 < pVVar3->nSize) {
    lVar9 = 0;
    do {
      iVar2 = *(int *)((long)pVVar3->pArray[lVar9] + 0x10);
      if (((long)iVar2 < 0) || ((int)local_70 <= iVar2)) goto LAB_0028bed2;
      iVar7 = **(int **)((long)pVVar3->pArray[lVar9] + 0x20);
      if (((long)iVar7 < 0) || ((int)__ptr_00[1] <= iVar7)) goto LAB_0028bed2;
      pVVar11 = (Vec_Int_t *)((long)iVar2 * 0x10 + (long)pvVar6);
      lVar12 = *(long *)(__ptr_00 + 2);
      lVar10 = (long)iVar7 * 0x10;
      Vec_IntPush(pVVar11,(int)lVar9);
      pVVar4 = local_68;
      Vec_IntTwoMerge2((Vec_Int_t *)(lVar12 + lVar10),pVVar11,local_68);
      local_88.tv_sec = *(long *)(lVar12 + lVar10);
      local_88.tv_nsec = ((long *)(lVar12 + lVar10))[1];
      piVar5 = pVVar4->pArray;
      *(undefined8 *)(lVar12 + lVar10) = *(undefined8 *)pVVar4;
      ((undefined8 *)(lVar12 + lVar10))[1] = piVar5;
      pVVar4->nCap = (int)local_88.tv_sec;
      pVVar4->nSize = (int)((ulong)local_88.tv_sec >> 0x20);
      pVVar4->pArray = (int *)local_88.tv_nsec;
      lVar9 = lVar9 + 1;
      pVVar3 = pNtk->vCos;
    } while (lVar9 < pVVar3->nSize);
  }
  pVVar4 = local_68;
  lVar9 = (long)local_50->nSize;
  if (0 < lVar9) {
    do {
      if (local_50->nSize < lVar9) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      local_38 = lVar9 + -1;
      pvVar6 = local_50->pArray[local_38];
      iVar2 = *(int *)((long)pvVar6 + 0x10);
      local_40 = lVar9;
      if ((long)iVar2 < 0) goto LAB_0028bed2;
      local_70 = CONCAT44(local_70._4_4_,__ptr_00[1]);
      if ((int)__ptr_00[1] <= iVar2) goto LAB_0028bed2;
      if (0 < *(int *)((long)pvVar6 + 0x1c)) {
        lVar9 = *(long *)(__ptr_00 + 2);
        lVar12 = 0;
        do {
          iVar7 = *(int *)(*(long *)((long)pvVar6 + 0x20) + lVar12 * 4);
          if (((long)iVar7 < 0) || ((int)local_70 <= iVar7)) goto LAB_0028bed2;
          lVar10 = (long)iVar7 * 0x10;
          Vec_IntTwoMerge2((Vec_Int_t *)(lVar9 + lVar10),(Vec_Int_t *)((long)iVar2 * 0x10 + lVar9),
                           pVVar4);
          local_88.tv_sec = *(long *)(lVar9 + lVar10);
          local_88.tv_nsec = ((long *)(lVar9 + lVar10))[1];
          piVar5 = pVVar4->pArray;
          *(undefined8 *)(lVar9 + lVar10) = *(undefined8 *)pVVar4;
          ((undefined8 *)(lVar9 + lVar10))[1] = piVar5;
          pVVar4->nCap = (int)local_88.tv_sec;
          pVVar4->nSize = (int)((ulong)local_88.tv_sec >> 0x20);
          pVVar4->pArray = (int *)local_88.tv_nsec;
          lVar12 = lVar12 + 1;
        } while (lVar12 < *(int *)((long)pvVar6 + 0x1c));
      }
      lVar9 = local_38;
    } while (1 < local_40);
  }
  pVVar4 = local_48;
  __ptr = local_50;
  pVVar3 = pNtk->vCis;
  if (0 < pVVar3->nSize) {
    lVar9 = 0;
    do {
      iVar2 = *(int *)((long)pVVar3->pArray[lVar9] + 0x10);
      if (((long)iVar2 < 0) || ((int)__ptr_00[1] <= iVar2)) {
LAB_0028bed2:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecWec.h"
                      ,0x9a,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
      }
      Vec_IntPush(pVVar4,*(int *)(*(long *)(__ptr_00 + 2) + 4 + (long)iVar2 * 0x10));
      lVar9 = lVar9 + 1;
      pVVar3 = pNtk->vCis;
    } while (lVar9 < pVVar3->nSize);
  }
  uVar1 = *__ptr_00;
  if (0 < (long)(int)uVar1) {
    lVar9 = *(long *)(__ptr_00 + 2);
    lVar12 = 0;
    do {
      pvVar6 = *(void **)(lVar9 + 8 + lVar12);
      if (pvVar6 != (void *)0x0) {
        free(pvVar6);
        *(undefined8 *)(lVar9 + 8 + lVar12) = 0;
      }
      lVar12 = lVar12 + 0x10;
    } while ((long)(int)uVar1 * 0x10 != lVar12);
  }
  if (*(void **)(__ptr_00 + 2) != (void *)0x0) {
    free(*(void **)(__ptr_00 + 2));
    __ptr_00[2] = 0;
    __ptr_00[3] = 0;
  }
  __ptr_00[0] = 0;
  __ptr_00[1] = 0;
  free(__ptr_00);
  iVar2 = local_5c;
  pVVar11 = local_68;
  if (__ptr->pArray != (void **)0x0) {
    free(__ptr->pArray);
    __ptr->pArray = (void **)0x0;
  }
  if (__ptr != (Vec_Ptr_t *)0x0) {
    free(__ptr);
  }
  if (pVVar11->pArray != (int *)0x0) {
    free(pVVar11->pArray);
    pVVar11->pArray = (int *)0x0;
  }
  free(pVVar11);
  if (iVar2 != 0) {
    iVar7 = 3;
    iVar2 = clock_gettime(3,&local_88);
    if (iVar2 < 0) {
      lVar9 = -1;
    }
    else {
      lVar9 = local_88.tv_nsec / 1000 + local_88.tv_sec * 1000000;
    }
    lVar9 = lVar9 + local_58;
    Abc_Print(iVar7,"%s =","Output support computation");
    Abc_Print(iVar7,"%9.2f sec\n",SUB84((double)lVar9 / 1000000.0,0));
  }
  return pVVar4;
}

Assistant:

Vec_Int_t * Abc_NtkCollectCiSupps( Abc_Ntk_t * pNtk, int fVerbose )
{
    abctime clk = Abc_Clock();
    Abc_Obj_t * pNode; int i, k;
    Vec_Ptr_t * vNodes = Abc_NtkDfs( pNtk, 0 );
    Vec_Int_t * vFanin, * vFanout, * vTemp = Vec_IntAlloc( 0 );
    Vec_Int_t * vSuppsCi = Vec_IntAlloc( Abc_NtkCiNum(pNtk) );
    Vec_Wec_t * vSupps = Vec_WecStart( Abc_NtkObjNumMax(pNtk) );
    Abc_NtkForEachCo( pNtk, pNode, i )
    {
        vFanout = Vec_WecEntry(vSupps, Abc_ObjId(pNode));
        vFanin = Vec_WecEntry(vSupps, Abc_ObjFaninId0(pNode));
        Vec_IntPush( vFanout, i );
        Vec_IntTwoMerge2( vFanin, vFanout, vTemp );
        ABC_SWAP( Vec_Int_t, *vFanin, *vTemp );
    }
    Vec_PtrForEachEntryReverse( Abc_Obj_t *, vNodes, pNode, i )
    {
        vFanout = Vec_WecEntry(vSupps, Abc_ObjId(pNode));
        for ( k = 0; k < Abc_ObjFaninNum(pNode); k++ )
        {
            vFanin = Vec_WecEntry(vSupps, Abc_ObjFaninId(pNode, k));
            Vec_IntTwoMerge2( vFanin, vFanout, vTemp );
            ABC_SWAP( Vec_Int_t, *vFanin, *vTemp );
        }
    }
    Abc_NtkForEachCi( pNtk, pNode, i )
        Vec_IntPush( vSuppsCi, Vec_IntSize(Vec_WecEntry(vSupps, Abc_ObjId(pNode))) );
    Vec_WecFree( vSupps );
    Vec_PtrFree( vNodes );
    Vec_IntFree( vTemp );
    if ( fVerbose )
        Abc_PrintTime( 1, "Output support computation", Abc_Clock() - clk );
    //Vec_IntPrint( vSuppsCi );
    return vSuppsCi;
}